

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderWalkRemoveRef(void *data,void *user)

{
  xmlChar *pxVar1;
  xmlAttrPtr attr;
  xmlRefPtr ref;
  
  if (*(void **)((long)data + 0x10) != user) {
    return 1;
  }
  pxVar1 = xmlStrdup(*(xmlChar **)((long)user + 0x10));
  *(xmlChar **)((long)data + 0x18) = pxVar1;
  *(undefined8 *)((long)data + 0x10) = 0;
  return 0;
}

Assistant:

static int
xmlTextReaderWalkRemoveRef(const void *data, void *user)
{
    xmlRefPtr ref = (xmlRefPtr)data;
    xmlAttrPtr attr = (xmlAttrPtr)user;

    if (ref->attr == attr) { /* Matched: remove and terminate walk */
        ref->name = xmlStrdup(attr->name);
        ref->attr = NULL;
        return 0;
    }
    return 1;
}